

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.h
# Opt level: O0

void run_container_remove_range(run_container_t *run,uint32_t min,uint32_t max)

{
  uint16_t ikey;
  uint16_t ikey_00;
  uint in_EDX;
  uint in_ESI;
  int32_t *in_RDI;
  uint16_t run_max;
  int32_t last;
  int32_t first;
  int32_t in_stack_ffffffffffffffd8;
  int32_t in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  ushort in_stack_ffffffffffffffe6;
  int local_18;
  int local_14;
  
  ikey = (uint16_t)in_ESI;
  local_14 = rle16_find_run(*(rle16_t **)(in_RDI + 2),*in_RDI,ikey);
  ikey_00 = (uint16_t)in_EDX;
  local_18 = rle16_find_run(*(rle16_t **)(in_RDI + 2),*in_RDI,ikey_00);
  if (((local_14 < 0) || (in_ESI <= *(ushort *)(*(long *)(in_RDI + 2) + (long)local_14 * 4))) ||
     ((uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_14 * 4) +
      (uint)*(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_14 * 4) <= in_EDX)) {
    if (local_14 < 0) {
      local_14 = -1 - local_14;
    }
    else if (*(ushort *)(*(long *)(in_RDI + 2) + (long)local_14 * 4) < in_ESI) {
      *(uint16_t *)(*(long *)(in_RDI + 2) + 2 + (long)local_14 * 4) =
           (ikey - 1) - *(short *)(*(long *)(in_RDI + 2) + (long)local_14 * 4);
      local_14 = local_14 + 1;
    }
    if (local_18 < 0) {
      local_18 = -2 - local_18;
    }
    else {
      in_stack_ffffffffffffffe6 =
           *(short *)(*(long *)(in_RDI + 2) + (long)local_18 * 4) +
           *(short *)(*(long *)(in_RDI + 2) + 2 + (long)local_18 * 4);
      if (in_EDX < in_stack_ffffffffffffffe6) {
        *(uint16_t *)(*(long *)(in_RDI + 2) + (long)local_18 * 4) = ikey_00 + 1;
        *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_18 * 4) =
             in_stack_ffffffffffffffe6 - (ikey_00 + 1);
        local_18 = local_18 + -1;
      }
    }
    if (local_14 <= local_18) {
      run_container_shift_tail
                ((run_container_t *)CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    }
  }
  else {
    makeRoomAtIndex((run_container_t *)CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)
                    ,(uint16_t)((uint)in_stack_ffffffffffffffdc >> 0x10));
    *(uint16_t *)(*(long *)(in_RDI + 2) + (long)(local_14 + 1) * 4) = ikey_00 + 1;
    *(uint16_t *)(*(long *)(in_RDI + 2) + 2 + (long)(local_14 + 1) * 4) =
         (*(short *)(*(long *)(in_RDI + 2) + (long)local_14 * 4) +
         *(short *)(*(long *)(in_RDI + 2) + 2 + (long)local_14 * 4)) - (ikey_00 + 1);
    *(uint16_t *)(*(long *)(in_RDI + 2) + 2 + (long)local_14 * 4) =
         (ikey - 1) - *(short *)(*(long *)(in_RDI + 2) + (long)local_14 * 4);
  }
  return;
}

Assistant:

static inline void run_container_remove_range(run_container_t *run,
                                              uint32_t min, uint32_t max) {
    int32_t first = rle16_find_run(run->runs, run->n_runs, (uint16_t)min);
    int32_t last = rle16_find_run(run->runs, run->n_runs, (uint16_t)max);

    if (first >= 0 && min > run->runs[first].value &&
        max < ((uint32_t)run->runs[first].value +
               (uint32_t)run->runs[first].length)) {
        // split this run into two adjacent runs

        // right subinterval
        makeRoomAtIndex(run, (uint16_t)(first + 1));
        run->runs[first + 1].value = (uint16_t)(max + 1);
        run->runs[first + 1].length =
            (uint16_t)((run->runs[first].value + run->runs[first].length) -
                       (max + 1));

        // left subinterval
        run->runs[first].length =
            (uint16_t)((min - 1) - run->runs[first].value);

        return;
    }

    // update left-most partial run
    if (first >= 0) {
        if (min > run->runs[first].value) {
            run->runs[first].length =
                (uint16_t)((min - 1) - run->runs[first].value);
            first++;
        }
    } else {
        first = -first - 1;
    }

    // update right-most run
    if (last >= 0) {
        uint16_t run_max = run->runs[last].value + run->runs[last].length;
        if (run_max > max) {
            run->runs[last].value = (uint16_t)(max + 1);
            run->runs[last].length = (uint16_t)(run_max - (max + 1));
            last--;
        }
    } else {
        last = (-last - 1) - 1;
    }

    // remove intermediate runs
    if (first <= last) {
        run_container_shift_tail(run, run->n_runs - (last + 1),
                                 -(last - first + 1));
    }
}